

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

Id __thiscall
anon_unknown.dwarf_12b4667::TGlslangToSpvTraverser::createInvocationsOperation
          (TGlslangToSpvTraverser *this,TOperator op,Id typeId,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *operands,TBasicType typeProxy)

{
  uint uVar1;
  SpvBuildLogger *this_00;
  bool bVar2;
  undefined4 uVar3;
  Id IVar4;
  Op OVar5;
  Id IVar6;
  Instruction *pIVar7;
  Op opCode;
  uint uVar8;
  pointer puVar9;
  Builder *pBVar10;
  IdImmediate groupOp;
  IdImmediate scope;
  vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> spvGroupOperands;
  GroupOperation local_88;
  IdImmediate local_80;
  string local_78;
  vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> local_58;
  TGlslangToSpvTraverser *local_40;
  ulong local_38;
  
  local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
  super__Vector_impl_data._M_finish = (IdImmediate *)0x0;
  local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (IdImmediate *)0x0;
  local_38 = (ulong)(op - EOpBallot);
  local_40 = this;
  if (op - EOpBallot < 3) {
    spv::Builder::addExtension(&this->builder,"SPV_KHR_shader_ballot");
    local_78._M_dataplus._M_p._0_4_ = 0x1147;
LAB_0044c7ce:
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,(Capability *)&local_78);
    local_88 = GroupOperationMax;
    goto LAB_0044c7e1;
  }
  pBVar10 = &this->builder;
  if (op - EOpAnyInvocation < 3) {
    spv::Builder::addExtension(pBVar10,"SPV_KHR_subgroup_vote");
    local_78._M_dataplus._M_p._0_4_ = 0x114f;
    goto LAB_0044c7ce;
  }
  local_78._M_dataplus._M_p._0_4_ = 0x12;
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
              *)&(this->builder).capabilities,(Capability *)&local_78);
  local_88 = GroupOperationMax;
  bVar2 = true;
  uVar1 = op - EOpMinInvocations;
  switch(uVar1) {
  case 0:
  case 1:
  case 2:
switchD_0044c95f_caseD_0:
    bVar2 = false;
    local_88 = GroupOperationReduce;
    break;
  case 3:
  case 4:
  case 5:
  case 9:
  case 10:
  case 0xb:
  case 0xf:
  case 0x10:
  case 0x11:
    spv::Builder::addExtension(pBVar10,"SPV_AMD_shader_ballot");
    if (uVar1 < 0x12) {
      if ((0x3fU >> (uVar1 & 0x1f) & 1) == 0) {
        if ((0xfc0U >> (uVar1 & 0x1f) & 1) == 0) goto switchD_0044c95f_caseD_c;
        goto switchD_0044c95f_caseD_6;
      }
      goto switchD_0044c95f_caseD_0;
    }
    break;
  case 6:
  case 7:
  case 8:
switchD_0044c95f_caseD_6:
    local_88 = GroupOperationInclusiveScan;
    goto LAB_0044ca46;
  case 0xc:
  case 0xd:
  case 0xe:
switchD_0044c95f_caseD_c:
    local_88 = ExclusiveScan;
LAB_0044ca46:
    bVar2 = false;
  }
  IVar6 = spv::Builder::makeIntegerType(pBVar10,0x20,false);
  IVar6 = spv::Builder::makeIntConstant(pBVar10,IVar6,3,false);
  local_78._M_dataplus._M_p._0_1_ = 1;
  local_78._M_dataplus._M_p._4_4_ = IVar6;
  if (local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<spv::IdImmediate,std::allocator<spv::IdImmediate>>::
    _M_realloc_insert<spv::IdImmediate_const&>
              ((vector<spv::IdImmediate,std::allocator<spv::IdImmediate>> *)&local_58,
               (iterator)
               local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
               _M_impl.super__Vector_impl_data._M_finish,(IdImmediate *)&local_78);
  }
  else {
    *local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
     super__Vector_impl_data._M_finish = (IdImmediate)local_78._M_dataplus._M_p;
    local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  uVar3 = local_80._0_4_;
  if (!bVar2) {
    local_80._0_4_ = local_80._0_4_ & 0xffffff00;
    local_80.word = local_88;
    if (local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<spv::IdImmediate,std::allocator<spv::IdImmediate>>::
      _M_realloc_insert<spv::IdImmediate_const&>
                ((vector<spv::IdImmediate,std::allocator<spv::IdImmediate>> *)&local_58,
                 (iterator)
                 local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_80);
    }
    else {
      *local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
       super__Vector_impl_data._M_finish =
           (IdImmediate)(CONCAT44(local_88,uVar3) & 0xffffffffffffff00);
      local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
LAB_0044c7e1:
  puVar9 = (operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar9 != (operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      local_78._M_dataplus._M_p._0_1_ = 1;
      local_78._M_dataplus._M_p._4_4_ = *puVar9;
      if (local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<spv::IdImmediate,std::allocator<spv::IdImmediate>>::
        _M_realloc_insert<spv::IdImmediate_const&>
                  ((vector<spv::IdImmediate,std::allocator<spv::IdImmediate>> *)&local_58,
                   (iterator)
                   local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(IdImmediate *)&local_78);
      }
      else {
        *local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
         super__Vector_impl_data._M_finish = (IdImmediate)local_78._M_dataplus._M_p;
        local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      puVar9 = puVar9 + 1;
    } while (puVar9 != (operands->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  if (0x11 < op - EOpMinInvocations) {
    if (5 < (uint)local_38) {
      this_00 = local_40->logger;
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"invocation operation","")
      ;
      spv::SpvBuildLogger::missingFunctionality(this_00,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      IVar6 = 0;
      goto LAB_0044cb57;
    }
    switch((long)&switchD_0044c898::switchdataD_008670a8 +
           (long)(int)(&switchD_0044c898::switchdataD_008670a8)[local_38]) {
    case 0x44c89a:
      pBVar10 = &local_40->builder;
      IVar6 = spv::Builder::makeIntegerType(pBVar10,0x20,false);
      IVar4 = spv::Builder::makeVectorType(pBVar10,IVar6,4);
      IVar4 = spv::Builder::createOp(pBVar10,OpSubgroupBallotKHR,IVar4,&local_58);
      local_78._M_dataplus._M_p = (pointer)0x0;
      local_78._M_string_length = 0;
      local_78.field_2._M_allocated_capacity = 0;
      local_80._0_4_ = spv::Builder::createCompositeExtract(pBVar10,IVar4,IVar6,0);
      if (local_78._M_string_length == local_78.field_2._M_allocated_capacity) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,
                   (iterator)local_78._M_string_length,(uint *)&local_80);
      }
      else {
        *(undefined4 *)local_78._M_string_length = local_80._0_4_;
        local_78._M_string_length = local_78._M_string_length + 4;
      }
      local_80._0_4_ = spv::Builder::createCompositeExtract(pBVar10,IVar4,IVar6,1);
      if (local_78._M_string_length == local_78.field_2._M_allocated_capacity) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,
                   (iterator)local_78._M_string_length,(uint *)&local_80);
      }
      else {
        *(undefined4 *)local_78._M_string_length = local_80._0_4_;
        local_78._M_string_length = local_78._M_string_length + 4;
      }
      IVar6 = spv::Builder::makeVectorType(pBVar10,IVar6,2);
      IVar6 = spv::Builder::createCompositeConstruct
                        (pBVar10,IVar6,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78);
      IVar6 = spv::Builder::createUnaryOp(pBVar10,OpBitcast,typeId,IVar6);
      if ((IdImmediate)local_78._M_dataplus._M_p != (IdImmediate)0x0) {
        operator_delete(local_78._M_dataplus._M_p,
                        local_78.field_2._M_allocated_capacity - (long)local_78._M_dataplus._M_p);
      }
      goto LAB_0044cb57;
    case 0x44caef:
      opCode = OpSubgroupAllKHR;
      break;
    case 0x44caf6:
      pIVar7 = (local_40->builder).module.idToInstruction.
               super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
               super__Vector_impl_data._M_start[typeId];
      opCode = OpSubgroupFirstInvocationKHR;
      goto LAB_0044ca11;
    case 0x44cb13:
      opCode = OpSubgroupAnyKHR;
      break;
    case 0x44cb1a:
      pIVar7 = (local_40->builder).module.idToInstruction.
               super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
               super__Vector_impl_data._M_start[typeId];
      opCode = OpSubgroupReadInvocationKHR;
      goto LAB_0044ca11;
    case 0x44cb37:
      opCode = OpSubgroupAllEqualKHR;
    }
    goto LAB_0044cb41;
  }
  uVar1 = typeProxy - EbtUint8;
  uVar8 = typeProxy - EbtFloat;
  switch(op) {
  default:
    OVar5 = OpGroupSMin - ((uVar1 & 0xfffffff9) == 0);
    opCode = OpGroupFMin;
    break;
  case EOpMaxInvocations:
  case EOpMaxInvocationsInclusiveScan:
  case EOpMaxInvocationsExclusiveScan:
    OVar5 = OpGroupSMax - ((uVar1 & 0xfffffff9) == 0);
    opCode = OpGroupFMax;
    break;
  case EOpAddInvocations:
  case EOpAddInvocationsInclusiveScan:
  case EOpAddInvocationsExclusiveScan:
    opCode = (uVar8 < 3) + OpGroupIAdd;
    goto LAB_0044c9fe;
  case EOpMinInvocationsNonUniform:
  case EOpMinInvocationsInclusiveScanNonUniform:
  case EOpMinInvocationsExclusiveScanNonUniform:
    OVar5 = OpGroupSMinNonUniformAMD - ((uVar1 & 0xfffffff9) == 0);
    opCode = OpGroupFMinNonUniformAMD;
    break;
  case EOpMaxInvocationsNonUniform:
  case EOpMaxInvocationsInclusiveScanNonUniform:
  case EOpMaxInvocationsExclusiveScanNonUniform:
    OVar5 = OpGroupSMaxNonUniformAMD - ((uVar1 & 0xfffffff9) == 0);
    opCode = OpGroupFMaxNonUniformAMD;
    break;
  case EOpAddInvocationsNonUniform:
  case EOpAddInvocationsInclusiveScanNonUniform:
  case EOpAddInvocationsExclusiveScanNonUniform:
    opCode = (uVar8 < 3) + OpGroupIAddNonUniformAMD;
    goto LAB_0044c9fe;
  }
  if (2 < uVar8) {
    opCode = OVar5;
  }
LAB_0044c9fe:
  pIVar7 = (local_40->builder).module.idToInstruction.
           super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
           super__Vector_impl_data._M_start[typeId];
LAB_0044ca11:
  if (pIVar7->opCode == OpTypeVector) {
    IVar6 = CreateInvocationsVectorOperation(local_40,opCode,local_88,typeId,operands);
  }
  else {
LAB_0044cb41:
    IVar6 = spv::Builder::createOp(&local_40->builder,opCode,typeId,&local_58);
  }
LAB_0044cb57:
  if (local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return IVar6;
}

Assistant:

spv::Id TGlslangToSpvTraverser::createInvocationsOperation(glslang::TOperator op, spv::Id typeId,
    std::vector<spv::Id>& operands, glslang::TBasicType typeProxy)
{
    bool isUnsigned = isTypeUnsignedInt(typeProxy);
    bool isFloat = isTypeFloat(typeProxy);

    spv::Op opCode = spv::OpNop;
    std::vector<spv::IdImmediate> spvGroupOperands;
    spv::GroupOperation groupOperation = spv::GroupOperationMax;

    if (op == glslang::EOpBallot || op == glslang::EOpReadFirstInvocation ||
        op == glslang::EOpReadInvocation) {
        builder.addExtension(spv::E_SPV_KHR_shader_ballot);
        builder.addCapability(spv::CapabilitySubgroupBallotKHR);
    } else if (op == glslang::EOpAnyInvocation ||
        op == glslang::EOpAllInvocations ||
        op == glslang::EOpAllInvocationsEqual) {
        builder.addExtension(spv::E_SPV_KHR_subgroup_vote);
        builder.addCapability(spv::CapabilitySubgroupVoteKHR);
    } else {
        builder.addCapability(spv::CapabilityGroups);
        if (op == glslang::EOpMinInvocationsNonUniform ||
            op == glslang::EOpMaxInvocationsNonUniform ||
            op == glslang::EOpAddInvocationsNonUniform ||
            op == glslang::EOpMinInvocationsInclusiveScanNonUniform ||
            op == glslang::EOpMaxInvocationsInclusiveScanNonUniform ||
            op == glslang::EOpAddInvocationsInclusiveScanNonUniform ||
            op == glslang::EOpMinInvocationsExclusiveScanNonUniform ||
            op == glslang::EOpMaxInvocationsExclusiveScanNonUniform ||
            op == glslang::EOpAddInvocationsExclusiveScanNonUniform)
            builder.addExtension(spv::E_SPV_AMD_shader_ballot);

        switch (op) {
        case glslang::EOpMinInvocations:
        case glslang::EOpMaxInvocations:
        case glslang::EOpAddInvocations:
        case glslang::EOpMinInvocationsNonUniform:
        case glslang::EOpMaxInvocationsNonUniform:
        case glslang::EOpAddInvocationsNonUniform:
            groupOperation = spv::GroupOperationReduce;
            break;
        case glslang::EOpMinInvocationsInclusiveScan:
        case glslang::EOpMaxInvocationsInclusiveScan:
        case glslang::EOpAddInvocationsInclusiveScan:
        case glslang::EOpMinInvocationsInclusiveScanNonUniform:
        case glslang::EOpMaxInvocationsInclusiveScanNonUniform:
        case glslang::EOpAddInvocationsInclusiveScanNonUniform:
            groupOperation = spv::GroupOperationInclusiveScan;
            break;
        case glslang::EOpMinInvocationsExclusiveScan:
        case glslang::EOpMaxInvocationsExclusiveScan:
        case glslang::EOpAddInvocationsExclusiveScan:
        case glslang::EOpMinInvocationsExclusiveScanNonUniform:
        case glslang::EOpMaxInvocationsExclusiveScanNonUniform:
        case glslang::EOpAddInvocationsExclusiveScanNonUniform:
            groupOperation = spv::GroupOperationExclusiveScan;
            break;
        default:
            break;
        }
        spv::IdImmediate scope = { true, builder.makeUintConstant(spv::ScopeSubgroup) };
        spvGroupOperands.push_back(scope);
        if (groupOperation != spv::GroupOperationMax) {
            spv::IdImmediate groupOp = { false, (unsigned)groupOperation };
            spvGroupOperands.push_back(groupOp);
        }
    }

    for (auto opIt = operands.begin(); opIt != operands.end(); ++opIt) {
        spv::IdImmediate op = { true, *opIt };
        spvGroupOperands.push_back(op);
    }

    switch (op) {
    case glslang::EOpAnyInvocation:
        opCode = spv::OpSubgroupAnyKHR;
        break;
    case glslang::EOpAllInvocations:
        opCode = spv::OpSubgroupAllKHR;
        break;
    case glslang::EOpAllInvocationsEqual:
        opCode = spv::OpSubgroupAllEqualKHR;
        break;
    case glslang::EOpReadInvocation:
        opCode = spv::OpSubgroupReadInvocationKHR;
        if (builder.isVectorType(typeId))
            return CreateInvocationsVectorOperation(opCode, groupOperation, typeId, operands);
        break;
    case glslang::EOpReadFirstInvocation:
        opCode = spv::OpSubgroupFirstInvocationKHR;
        if (builder.isVectorType(typeId))
            return CreateInvocationsVectorOperation(opCode, groupOperation, typeId, operands);
        break;
    case glslang::EOpBallot:
    {
        // NOTE: According to the spec, the result type of "OpSubgroupBallotKHR" must be a 4 component vector of 32
        // bit integer types. The GLSL built-in function "ballotARB()" assumes the maximum number of invocations in
        // a subgroup is 64. Thus, we have to convert uvec4.xy to uint64_t as follow:
        //
        //     result = Bitcast(SubgroupBallotKHR(Predicate).xy)
        //
        spv::Id uintType  = builder.makeUintType(32);
        spv::Id uvec4Type = builder.makeVectorType(uintType, 4);
        spv::Id result = builder.createOp(spv::OpSubgroupBallotKHR, uvec4Type, spvGroupOperands);

        std::vector<spv::Id> components;
        components.push_back(builder.createCompositeExtract(result, uintType, 0));
        components.push_back(builder.createCompositeExtract(result, uintType, 1));

        spv::Id uvec2Type = builder.makeVectorType(uintType, 2);
        return builder.createUnaryOp(spv::OpBitcast, typeId,
                                     builder.createCompositeConstruct(uvec2Type, components));
    }

    case glslang::EOpMinInvocations:
    case glslang::EOpMaxInvocations:
    case glslang::EOpAddInvocations:
    case glslang::EOpMinInvocationsInclusiveScan:
    case glslang::EOpMaxInvocationsInclusiveScan:
    case glslang::EOpAddInvocationsInclusiveScan:
    case glslang::EOpMinInvocationsExclusiveScan:
    case glslang::EOpMaxInvocationsExclusiveScan:
    case glslang::EOpAddInvocationsExclusiveScan:
        if (op == glslang::EOpMinInvocations ||
            op == glslang::EOpMinInvocationsInclusiveScan ||
            op == glslang::EOpMinInvocationsExclusiveScan) {
            if (isFloat)
                opCode = spv::OpGroupFMin;
            else {
                if (isUnsigned)
                    opCode = spv::OpGroupUMin;
                else
                    opCode = spv::OpGroupSMin;
            }
        } else if (op == glslang::EOpMaxInvocations ||
                   op == glslang::EOpMaxInvocationsInclusiveScan ||
                   op == glslang::EOpMaxInvocationsExclusiveScan) {
            if (isFloat)
                opCode = spv::OpGroupFMax;
            else {
                if (isUnsigned)
                    opCode = spv::OpGroupUMax;
                else
                    opCode = spv::OpGroupSMax;
            }
        } else {
            if (isFloat)
                opCode = spv::OpGroupFAdd;
            else
                opCode = spv::OpGroupIAdd;
        }

        if (builder.isVectorType(typeId))
            return CreateInvocationsVectorOperation(opCode, groupOperation, typeId, operands);

        break;
    case glslang::EOpMinInvocationsNonUniform:
    case glslang::EOpMaxInvocationsNonUniform:
    case glslang::EOpAddInvocationsNonUniform:
    case glslang::EOpMinInvocationsInclusiveScanNonUniform:
    case glslang::EOpMaxInvocationsInclusiveScanNonUniform:
    case glslang::EOpAddInvocationsInclusiveScanNonUniform:
    case glslang::EOpMinInvocationsExclusiveScanNonUniform:
    case glslang::EOpMaxInvocationsExclusiveScanNonUniform:
    case glslang::EOpAddInvocationsExclusiveScanNonUniform:
        if (op == glslang::EOpMinInvocationsNonUniform ||
            op == glslang::EOpMinInvocationsInclusiveScanNonUniform ||
            op == glslang::EOpMinInvocationsExclusiveScanNonUniform) {
            if (isFloat)
                opCode = spv::OpGroupFMinNonUniformAMD;
            else {
                if (isUnsigned)
                    opCode = spv::OpGroupUMinNonUniformAMD;
                else
                    opCode = spv::OpGroupSMinNonUniformAMD;
            }
        }
        else if (op == glslang::EOpMaxInvocationsNonUniform ||
                 op == glslang::EOpMaxInvocationsInclusiveScanNonUniform ||
                 op == glslang::EOpMaxInvocationsExclusiveScanNonUniform) {
            if (isFloat)
                opCode = spv::OpGroupFMaxNonUniformAMD;
            else {
                if (isUnsigned)
                    opCode = spv::OpGroupUMaxNonUniformAMD;
                else
                    opCode = spv::OpGroupSMaxNonUniformAMD;
            }
        }
        else {
            if (isFloat)
                opCode = spv::OpGroupFAddNonUniformAMD;
            else
                opCode = spv::OpGroupIAddNonUniformAMD;
        }

        if (builder.isVectorType(typeId))
            return CreateInvocationsVectorOperation(opCode, groupOperation, typeId, operands);

        break;
    default:
        logger->missingFunctionality("invocation operation");
        return spv::NoResult;
    }

    assert(opCode != spv::OpNop);
    return builder.createOp(opCode, typeId, spvGroupOperands);
}